

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

int ON_SubDComponentPtr::CompareType(ON_SubDComponentPtr *a,ON_SubDComponentPtr *b)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  
  if (a == b) {
    return 0;
  }
  if (a == (ON_SubDComponentPtr *)0x0) {
    return 1;
  }
  if (b == (ON_SubDComponentPtr *)0x0) {
    return -1;
  }
  uVar1 = (uint)a->m_ptr & 6;
  iVar2 = -1;
  switch((uint)b->m_ptr & 6) {
  case 0:
    iVar2 = 1;
    bVar3 = 0;
    bVar4 = 0;
    cVar5 = '\0';
    goto LAB_005c5e31;
  case 2:
    cVar5 = '\x02';
    bVar3 = 1;
    break;
  case 4:
    cVar5 = '\x04';
    bVar4 = 1;
    bVar3 = 0;
    goto LAB_005c5e31;
  case 6:
    cVar5 = '\x06';
    bVar3 = 0;
  }
  bVar4 = 0;
LAB_005c5e31:
  if (cVar5 != (char)(0x6020402020200 >> (sbyte)(uVar1 << 3))) {
    switch(uVar1) {
    case 0:
      return iVar2;
    case 2:
      return -1;
    case 6:
      bVar3 = bVar3 | bVar4;
    }
    return bVar3 - 1 | 1;
  }
  return 0;
}

Assistant:

int ON_SubDComponentPtr::CompareType(
  const ON_SubDComponentPtr* a,
  const ON_SubDComponentPtr* b
  )
{
  if ( a == b )
    return 0;
    // sort nullptrs to ends of arrays
  if ( nullptr == a )
    return 1; // nonzero b < nullptr a
  if ( nullptr == b )
    return -1; // nonzero a < nullptr b
  return ON_SubDComponentPtr::CompareComponentPtrType(a->ComponentType(), b->ComponentType());
}